

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O0

bool __thiscall
cmCursesStringWidget::HandleInput
          (cmCursesStringWidget *this,int *key,cmCursesMainForm *fm,WINDOW *w)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  FORM *form_00;
  int p1;
  int p1_00;
  int p1_01;
  int p1_02;
  int p1_03;
  int p1_04;
  int p1_05;
  int p1_06;
  int p1_07;
  int p1_08;
  int local_174;
  int local_14c;
  int local_110;
  int local_10c;
  allocator local_e9;
  string local_e8;
  char local_c8 [8];
  char debugMessage [128];
  FORM *form;
  int y;
  int x;
  WINDOW *w_local;
  cmCursesMainForm *fm_local;
  int *key_local;
  cmCursesStringWidget *this_local;
  
  form_00 = cmCursesForm::GetForm(&fm->super_cmCursesForm);
  if (((((this->super_cmCursesWidget).field_0x3c & 1) == 0) && (*key != 10)) && (*key != 0x157)) {
    this_local._7_1_ = false;
  }
  else {
    this->OriginalString = (char *)0x0;
    this->Done = false;
    while (((this->Done ^ 0xffU) & 1) != 0) {
      sprintf(local_c8,"String widget handling input, key: %d",(ulong)(uint)*key);
      cmCursesForm::LogMessage(local_c8);
      iVar4 = 0;
      cmCursesMainForm::PrintKeys(fm,0);
      if (_stdscr == 0) {
        local_10c = -1;
        local_110 = -1;
      }
      else {
        local_10c = *(short *)(_stdscr + 4) + 1;
        local_110 = *(short *)(_stdscr + 6) + 1;
      }
      if ((local_110 < 0x41) || (local_10c < 6)) {
        if (*key == 0x71) {
          return false;
        }
        iVar4 = wgetch(_stdscr);
        *key = iVar4;
      }
      else {
        if ((((this->super_cmCursesWidget).field_0x3c & 1) == 0) &&
           ((*key != 10 && (*key != 0x157)))) {
          return false;
        }
        if ((*key == 10) || (*key == 0x157)) {
          (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[8])(this,fm,w);
          goto LAB_0042ce22;
        }
        if (*key == 0x102) {
LAB_0042ca69:
          (this->super_cmCursesWidget).field_0x3c = 0;
          if (this->OriginalString != (char *)0x0) {
            operator_delete__(this->OriginalString);
          }
          form_driver((FORM_conflict *)form_00,0x204);
          form_driver((FORM_conflict *)form_00,0x205);
          return false;
        }
        uVar1 = *key;
        uVar5 = ctrl((EVP_PKEY_CTX *)0x6e,iVar4,p1,&stdscr);
        if ((uVar1 == uVar5) || (*key == 0x103)) goto LAB_0042ca69;
        uVar1 = *key;
        uVar5 = ctrl((EVP_PKEY_CTX *)0x70,iVar4,p1_00,(void *)(ulong)uVar5);
        if ((uVar1 == uVar5) || (*key == 0x152)) goto LAB_0042ca69;
        uVar1 = *key;
        uVar5 = ctrl((EVP_PKEY_CTX *)0x64,iVar4,p1_01,(void *)(ulong)uVar5);
        if ((uVar1 == uVar5) || (*key == 0x153)) goto LAB_0042ca69;
        uVar1 = *key;
        uVar5 = ctrl((EVP_PKEY_CTX *)0x75,iVar4,p1_02,(void *)(ulong)uVar5);
        if (uVar1 == uVar5) goto LAB_0042ca69;
        if (*key == 0x1b) {
          if (((this->super_cmCursesWidget).field_0x3c & 1) != 0) {
            (this->super_cmCursesWidget).field_0x3c = 0;
            cmCursesMainForm::PrintKeys(fm,0);
            pcVar3 = this->OriginalString;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_e8,pcVar3,&local_e9);
            SetString(this,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_e9);
            if (this->OriginalString != (char *)0x0) {
              operator_delete__(this->OriginalString);
            }
            if (w == (WINDOW *)0x0) {
              local_14c = -1;
            }
            else {
              local_14c = w->_maxy + 1;
            }
            wtouchln(w,0,local_14c,1);
            wrefresh(w);
            return true;
          }
        }
        else if (*key == 9) {
          (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[7])(this,fm,w);
        }
        else {
          if (*key != 0x104) {
            uVar1 = *key;
            uVar5 = ctrl((EVP_PKEY_CTX *)0x62,iVar4,p1_03,(void *)(ulong)uVar5);
            if (uVar1 != uVar5) {
              if (*key != 0x105) {
                uVar1 = *key;
                uVar5 = ctrl((EVP_PKEY_CTX *)0x66,iVar4,p1_04,(void *)(ulong)uVar5);
                if (uVar1 != uVar5) {
                  uVar1 = *key;
                  uVar5 = ctrl((EVP_PKEY_CTX *)0x6b,iVar4,p1_05,(void *)(ulong)uVar5);
                  if (uVar1 == uVar5) {
                    form_driver((FORM_conflict *)form_00,0x225);
                  }
                  else {
                    uVar1 = *key;
                    uVar5 = ctrl((EVP_PKEY_CTX *)0x61,iVar4,p1_06,(void *)(ulong)uVar5);
                    if ((uVar1 == uVar5) || (*key == 0x106)) {
                      form_driver((FORM_conflict *)form_00,0x216);
                    }
                    else {
                      uVar1 = *key;
                      uVar5 = ctrl((EVP_PKEY_CTX *)0x65,iVar4,p1_07,(void *)(ulong)uVar5);
                      if ((uVar1 == uVar5) || (*key == 0x168)) {
                        form_driver((FORM_conflict *)form_00,0x217);
                      }
                      else if ((*key == 0x7f) || (*key == 0x107)) {
                        if (0 < form_00->curcol) {
                          form_driver((FORM_conflict *)form_00,0x222);
                        }
                      }
                      else {
                        iVar2 = *key;
                        iVar4 = ctrl((EVP_PKEY_CTX *)0x64,iVar4,p1_08,(void *)(ulong)uVar5);
                        if ((iVar2 == iVar4) || (*key == 0x14a)) {
                          if (-1 < form_00->curcol) {
                            form_driver((FORM_conflict *)form_00,0x221);
                          }
                        }
                        else {
                          (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[9])(this,key,fm,w);
                        }
                      }
                    }
                  }
                  goto LAB_0042ce22;
                }
              }
              form_driver((FORM_conflict *)form_00,0x210);
              goto LAB_0042ce22;
            }
          }
          form_driver((FORM_conflict *)form_00,0x211);
        }
LAB_0042ce22:
        if ((this->Done & 1U) == 0) {
          if (w == (WINDOW *)0x0) {
            local_174 = -1;
          }
          else {
            local_174 = w->_maxy + 1;
          }
          wtouchln(w,0,local_174,1);
          wrefresh(w);
          iVar4 = wgetch(_stdscr);
          *key = iVar4;
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCursesStringWidget::HandleInput(int& key, cmCursesMainForm* fm,
                                       WINDOW* w)
{
  int x,y;

  FORM* form = fm->GetForm();
  // 10 == enter
  if (!this->InEdit && ( key != 10 && key != KEY_ENTER ) )
    {
    return false;
    }

  this->OriginalString=0;
  this->Done = false;

  char debugMessage[128];

  // <Enter> is used to change edit mode (like <Esc> in vi).
  while(!this->Done)
    {
    sprintf(debugMessage, "String widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    fm->PrintKeys();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if ( x < cmCursesMainForm::MIN_WIDTH  ||
         y < cmCursesMainForm::MIN_HEIGHT )
      {
      // quit
      if ( key == 'q' )
        {
        return false;
        }
      else
        {
        key=getch();
        continue;
        }
      }

    // If resize occured during edit, move out of edit mode
    if (!this->InEdit && ( key != 10 && key != KEY_ENTER ) )
      {
      return false;
      }
    // 10 == enter
    if (key == 10 || key == KEY_ENTER)
      {
      this->OnReturn(fm, w);
      }
    else if ( key == KEY_DOWN || key == ctrl('n') ||
              key == KEY_UP || key == ctrl('p') ||
              key == KEY_NPAGE || key == ctrl('d') ||
              key == KEY_PPAGE || key == ctrl('u'))
      {
      this->InEdit = false;
      delete[] this->OriginalString;
      // trick to force forms to update the field buffer
      form_driver(form, REQ_NEXT_FIELD);
      form_driver(form, REQ_PREV_FIELD);
      return false;
      }
    // esc
    else if (key == 27)
      {
      if (this->InEdit)
        {
        this->InEdit = false;
        fm->PrintKeys();
        this->SetString(this->OriginalString);
        delete[] this->OriginalString;
        touchwin(w);
        wrefresh(w);
        return true;
        }
      }
    else if ( key == 9 )
      {
      this->OnTab(fm, w);
      }
    else if ( key == KEY_LEFT || key == ctrl('b') )
      {
      form_driver(form, REQ_PREV_CHAR);
      }
    else if ( key == KEY_RIGHT || key == ctrl('f') )
      {
      form_driver(form, REQ_NEXT_CHAR);
      }
    else if ( key == ctrl('k') )
      {
      form_driver(form, REQ_CLR_EOL);
      }
    else if ( key == ctrl('a') || key == KEY_HOME )
      {
      form_driver(form, REQ_BEG_FIELD);
      }
    else if ( key == ctrl('e') || key == KEY_END )
      {
      form_driver(form, REQ_END_FIELD);
      }
    else if ( key == 127 ||
              key == KEY_BACKSPACE )
      {
      if ( form->curcol > 0 )
        {
        form_driver(form, REQ_DEL_PREV);
        }
      }
    else if ( key == ctrl('d') ||key == KEY_DC )
      {
      if ( form->curcol >= 0 )
        {
        form_driver(form, REQ_DEL_CHAR);
        }
      }
    else
      {
      this->OnType(key, fm, w);
      }
    if ( !this->Done )
      {
      touchwin(w);
      wrefresh(w);

      key=getch();
      }
    }
  return true;
}